

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::POMDPX::ExactInitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          POMDPX *this)

{
  int iVar1;
  State *pSVar2;
  int s;
  ulong uVar3;
  State *local_30;
  undefined4 extraout_var;
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_MDP)._vptr_MDP[2])(this);
    if ((long)iVar1 <= (long)uVar3) break;
    Parser::InitialWeight
              (this->parser_,
               &(this->states_).
                super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar3]->vec_id);
    iVar1 = (*(this->super_MDP)._vptr_MDP[0x19])(this,uVar3 & 0xffffffff);
    pSVar2 = (State *)CONCAT44(extraout_var,iVar1);
    if ((pSVar2->weight != 0.0) || (NAN(pSVar2->weight))) {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(pSVar2 + 1),
                 &(this->states_).
                  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar3]->vec_id);
      local_30 = pSVar2;
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
                 &local_30);
    }
    else {
      (*(this->super_MDP)._vptr_MDP[0x1b])(this,pSVar2);
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> POMDPX::ExactInitialParticleSet() const {
	vector<State*> particles;

	for (int s = 0; s < NumStates(); s++) {
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(s,
			parser_->InitialWeight(states_[s]->vec_id)));
		if (state->weight == 0) {
			Free(state);
		} else {
			state->vec_id = states_[s]->vec_id;
			particles.push_back(state);
		}
	}

	return particles;
}